

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

void xemmai::ast::anon_unknown_11::f_emit_block
               (t_emit *a_emit,
               vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
               *a_nodes,bool a_tail,bool a_clear,bool a_preserve)

{
  bool bVar1;
  reference puVar2;
  pointer ptVar3;
  __normal_iterator<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
  local_30;
  const_iterator j;
  const_iterator i;
  bool a_preserve_local;
  bool a_clear_local;
  bool a_tail_local;
  vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
  *a_nodes_local;
  t_emit *a_emit_local;
  
  j = std::
      vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
      ::begin(a_nodes);
  local_30._M_current =
       (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
       std::
       vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
       ::end(a_nodes);
  bVar1 = __gnu_cxx::
          operator==<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                    (&j,&local_30);
  if (bVar1) {
    if (!a_clear) {
      if (a_preserve) {
        t_emit::f_push(a_emit);
      }
      else {
        t_emit::f_emit_null(a_emit);
      }
    }
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
    ::operator--(&local_30);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                             (&j,&local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar2 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
               ::operator*(&j);
      ptVar3 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
               operator->(puVar2);
      (*ptVar3->_vptr_t_node[3])(ptVar3,a_emit,0,0,1);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
      ::operator++(&j);
    }
    puVar2 = __gnu_cxx::
             __normal_iterator<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
             ::operator*(&j);
    ptVar3 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
             operator->(puVar2);
    (*ptVar3->_vptr_t_node[3])(ptVar3,a_emit,(ulong)a_tail,0,(ulong)a_clear);
  }
  return;
}

Assistant:

void f_emit_block(t_emit& a_emit, const std::vector<std::unique_ptr<t_node>>& a_nodes, bool a_tail, bool a_clear, bool a_preserve = false)
{
	auto i = a_nodes.begin();
	auto j = a_nodes.end();
	if (i == j) {
		if (!a_clear) a_preserve ? a_emit.f_push() : a_emit.f_emit_null();
	} else {
		for (--j; i != j; ++i) (*i)->f_emit(a_emit, false, false, true);
		(*i)->f_emit(a_emit, a_tail, false, a_clear);
	}
}